

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_init_table(fitsfile *outfptr,int inbitpix,int naxis,long *naxes,int writebitpix,
                     int *status)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  int local_1bc;
  int local_1b8;
  int secondDim;
  int firstDim;
  int noHigherDims;
  int nQualifyDims;
  int is_primary;
  long actual_tilesize [6];
  char comm [73];
  char *tunit [3];
  char local_104 [4];
  char local_100 [4];
  char tf2 [4];
  char tf1 [4];
  char tf0 [4];
  char *tform [3];
  char *local_d8;
  char *ttype [3];
  long local_b8;
  long nrows;
  int local_a8;
  int bitpix;
  int ncols;
  int addToDim;
  int ndiv;
  int remain;
  int ii;
  char zcmptype [12];
  char keyname [75];
  int *status_local;
  int writebitpix_local;
  long *naxes_local;
  int naxis_local;
  int inbitpix_local;
  fitsfile *outfptr_local;
  
  local_d8 = "COMPRESSED_DATA";
  ttype[0] = "ZSCALE";
  ttype[1] = "ZZERO";
  stack0xfffffffffffffed8 = "";
  firstDim = 0;
  bVar2 = true;
  local_1b8 = -1;
  local_1bc = -1;
  if (*status < 1) {
    if ((((-1 < inbitpix) || (fVar1 = outfptr->Fptr->request_quantize_level, fVar1 != 9999.0)) ||
        (NAN(fVar1))) ||
       ((outfptr->Fptr->request_compress_type == 0x15 ||
        (outfptr->Fptr->request_compress_type == 0x16)))) {
      if (outfptr->Fptr->request_compress_type == 0) {
        outfptr->Fptr->request_compress_type = 0xb;
      }
      if ((inbitpix < 0) &&
         ((fVar1 = outfptr->Fptr->request_quantize_level, fVar1 != 9999.0 || (NAN(fVar1))))) {
        if (outfptr->Fptr->request_quantize_method == 0) {
          outfptr->Fptr->request_quantize_method = 1;
        }
        fVar1 = outfptr->Fptr->request_quantize_level;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          if (outfptr->Fptr->request_quantize_method == -1) {
            outfptr->Fptr->request_quantize_level = 16.0;
          }
          else {
            outfptr->Fptr->request_quantize_level = 4.0;
          }
        }
      }
      if (inbitpix == 0x14) {
        nrows._4_4_ = 0x10;
      }
      else if (inbitpix == 0x28) {
        nrows._4_4_ = 0x20;
      }
      else {
        nrows._4_4_ = inbitpix;
        if (inbitpix == 10) {
          nrows._4_4_ = 8;
        }
      }
      memcpy(&nQualifyDims,outfptr->Fptr->request_tilesize,0x30);
      if (outfptr->Fptr->request_compress_type == 0x29) {
        if (naxis < 2) {
          ffpmsg("Hcompress cannot be used with 1-dimensional images (imcomp_init_table)");
          *status = 0x19d;
          return 0x19d;
        }
        for (ndiv = 0; ndiv < naxis; ndiv = ndiv + 1) {
          if (3 < naxes[ndiv]) {
            firstDim = firstDim + 1;
          }
        }
        if (firstDim < 2) {
          ffpmsg("Hcompress minimum image dimension is 4 pixels (imcomp_init_table)");
          *status = 0x19d;
          return 0x19d;
        }
        for (ndiv = 1; ndiv < naxis; ndiv = ndiv + 1) {
          if ((*(long *)(&nQualifyDims + (long)ndiv * 2) != 0) &&
             (*(long *)(&nQualifyDims + (long)ndiv * 2) != 1)) {
            bVar2 = false;
            break;
          }
        }
        if ((_nQualifyDims < 1) && (actual_tilesize[0] == -1)) {
          _nQualifyDims = *naxes;
          actual_tilesize[0] = naxes[1];
          for (ndiv = 2; ndiv < naxis; ndiv = ndiv + 1) {
            (&nQualifyDims + (long)ndiv * 2)[0] = 1;
            (&nQualifyDims + (long)ndiv * 2)[1] = 0;
          }
        }
        else if ((_nQualifyDims < 1) && (bVar2)) {
          _nQualifyDims = *naxes;
          if (naxes[1] < 0x1f) {
            actual_tilesize[0] = naxes[1];
          }
          else if ((naxes[1] % 0x10 == 0) || (3 < naxes[1] % 0x10)) {
            actual_tilesize[0] = 0x10;
          }
          else if ((naxes[1] % 0x18 == 0) || (3 < naxes[1] % 0x18)) {
            actual_tilesize[0] = 0x18;
          }
          else if ((naxes[1] % 0x14 == 0) || (3 < naxes[1] % 0x14)) {
            actual_tilesize[0] = 0x14;
          }
          else if ((naxes[1] % 0x1e == 0) || (3 < naxes[1] % 0x1e)) {
            actual_tilesize[0] = 0x1e;
          }
          else if ((naxes[1] % 0x1c == 0) || (3 < naxes[1] % 0x1c)) {
            actual_tilesize[0] = 0x1c;
          }
          else if ((naxes[1] % 0x1a == 0) || (3 < naxes[1] % 0x1a)) {
            actual_tilesize[0] = 0x1a;
          }
          else if ((naxes[1] % 0x16 == 0) || (3 < naxes[1] % 0x16)) {
            actual_tilesize[0] = 0x16;
          }
          else if ((naxes[1] % 0x12 == 0) || (3 < naxes[1] % 0x12)) {
            actual_tilesize[0] = 0x12;
          }
          else if ((naxes[1] % 0xe == 0) || (3 < naxes[1] % 0xe)) {
            actual_tilesize[0] = 0xe;
          }
          else {
            actual_tilesize[0] = 0x11;
          }
        }
        else {
          if (_nQualifyDims < 1) {
            _nQualifyDims = *naxes;
          }
          for (ndiv = 1; ndiv < naxis; ndiv = ndiv + 1) {
            if (*(long *)(&nQualifyDims + (long)ndiv * 2) < 0) {
              *(long *)(&nQualifyDims + (long)ndiv * 2) = naxes[ndiv];
            }
            else if (*(long *)(&nQualifyDims + (long)ndiv * 2) == 0) {
              (&nQualifyDims + (long)ndiv * 2)[0] = 1;
              (&nQualifyDims + (long)ndiv * 2)[1] = 0;
            }
          }
        }
        for (ndiv = 0; ndiv < naxis; ndiv = ndiv + 1) {
          if (1 < *(long *)(&nQualifyDims + (long)ndiv * 2)) {
            if (local_1b8 < 0) {
              local_1b8 = ndiv;
            }
            else {
              if (-1 < local_1bc) {
                ffpmsg("Hcompress tiles can only have 2 dimensions (imcomp_init_table)");
                *status = 0x19d;
                return 0x19d;
              }
              local_1bc = ndiv;
            }
          }
        }
        if ((local_1b8 < 0) || (local_1bc < 0)) {
          ffpmsg("Hcompress tiles must have 2 dimensions (imcomp_init_table)");
          *status = 0x19d;
          return 0x19d;
        }
        if ((*(long *)(&nQualifyDims + (long)local_1b8 * 2) < 4) ||
           (*(long *)(&nQualifyDims + (long)local_1bc * 2) < 4)) {
          ffpmsg("Hcompress minimum tile dimension is 4 pixels (imcomp_init_table)");
          *status = 0x19d;
          return 0x19d;
        }
        iVar3 = (int)(naxes[local_1b8] % *(long *)(&nQualifyDims + (long)local_1b8 * 2));
        if ((0 < iVar3) && (iVar3 < 4)) {
          dVar4 = ceil((double)iVar3 /
                       (double)(int)(naxes[local_1b8] /
                                    *(long *)(&nQualifyDims + (long)local_1b8 * 2)));
          *(long *)(&nQualifyDims + (long)local_1b8 * 2) =
               (long)(int)dVar4 + *(long *)(&nQualifyDims + (long)local_1b8 * 2);
          iVar3 = (int)(naxes[local_1b8] % *(long *)(&nQualifyDims + (long)local_1b8 * 2));
          if ((0 < iVar3) && (iVar3 < 4)) {
            ffpmsg("Last tile along 1st dimension has less than 4 pixels (imcomp_init_table)");
            *status = 0x19d;
            return 0x19d;
          }
        }
        iVar3 = (int)(naxes[local_1bc] % *(long *)(&nQualifyDims + (long)local_1bc * 2));
        if ((0 < iVar3) && (iVar3 < 4)) {
          dVar4 = ceil((double)iVar3 /
                       (double)(int)(naxes[local_1bc] /
                                    *(long *)(&nQualifyDims + (long)local_1bc * 2)));
          *(long *)(&nQualifyDims + (long)local_1bc * 2) =
               (long)(int)dVar4 + *(long *)(&nQualifyDims + (long)local_1bc * 2);
          iVar3 = (int)(naxes[local_1bc] % *(long *)(&nQualifyDims + (long)local_1bc * 2));
          if ((0 < iVar3) && (iVar3 < 4)) {
            ffpmsg("Last tile along 2nd dimension has less than 4 pixels (imcomp_init_table)");
            *status = 0x19d;
            return 0x19d;
          }
        }
      }
      for (ndiv = 0; ndiv < naxis; ndiv = ndiv + 1) {
        if (ndiv == 0) {
          if (_nQualifyDims < 1) {
            _nQualifyDims = *naxes;
          }
        }
        else if (*(long *)(&nQualifyDims + (long)ndiv * 2) < 0) {
          *(long *)(&nQualifyDims + (long)ndiv * 2) = naxes[ndiv];
        }
        else if (*(long *)(&nQualifyDims + (long)ndiv * 2) == 0) {
          (&nQualifyDims + (long)ndiv * 2)[0] = 1;
          (&nQualifyDims + (long)ndiv * 2)[1] = 0;
        }
      }
      if (outfptr->Fptr->request_huge_hdu == 0) {
        strcpy(tf2,"1PB");
      }
      else {
        strcpy(tf2,"1QB");
      }
      strcpy(local_100,"1D");
      strcpy(local_104,"1D");
      _tf1 = tf2;
      local_b8 = 1;
      for (ndiv = 0; ndiv < naxis; ndiv = ndiv + 1) {
        local_b8 = local_b8 * ((naxes[ndiv] + -1) / *(long *)(&nQualifyDims + (long)ndiv * 2) + 1);
      }
      if ((nrows._4_4_ < 0) &&
         ((fVar1 = outfptr->Fptr->request_quantize_level, fVar1 != 9999.0 || (NAN(fVar1))))) {
        local_a8 = 3;
      }
      else {
        local_a8 = 1;
      }
      if (outfptr->Fptr->request_compress_type == 0xb) {
        strcpy((char *)&remain,"RICE_1");
      }
      else if (outfptr->Fptr->request_compress_type == 0x15) {
        strcpy((char *)&remain,"GZIP_1");
      }
      else if (outfptr->Fptr->request_compress_type == 0x16) {
        strcpy((char *)&remain,"GZIP_2");
      }
      else if (outfptr->Fptr->request_compress_type == 0x33) {
        strcpy((char *)&remain,"BZIP2_1");
      }
      else if (outfptr->Fptr->request_compress_type == 0x1f) {
        strcpy((char *)&remain,"PLIO_1");
        if (outfptr->Fptr->request_huge_hdu == 0) {
          strcpy(_tf1,"1PI");
        }
        else {
          strcpy(_tf1,"1QI");
        }
      }
      else if (outfptr->Fptr->request_compress_type == 0x29) {
        strcpy((char *)&remain,"HCOMPRESS_1");
      }
      else {
        if (outfptr->Fptr->request_compress_type != -1) {
          ffpmsg("unknown compression type (imcomp_init_table)");
          *status = 0x19d;
          return 0x19d;
        }
        strcpy((char *)&remain,"NOCOMPRESS");
      }
      iVar3 = outfptr->Fptr->curhdu;
      ffcrtb(outfptr,2,local_b8,local_a8,&local_d8,(char **)tf1,(char **)(comm + 0x48),(char *)0x0,
             status);
      ffpkyl(outfptr,"ZIMAGE",1,"extension contains compressed image",status);
      if (writebitpix != 0) {
        if (iVar3 == 0) {
          ffpkyl(outfptr,"ZSIMPLE",1,"file does conform to FITS standard",status);
        }
        ffpkyj(outfptr,"ZBITPIX",(long)nrows._4_4_,"data type of original image",status);
        ffpkyj(outfptr,"ZNAXIS",(long)naxis,"dimension of original image",status);
        for (ndiv = 0; ndiv < naxis; ndiv = ndiv + 1) {
          snprintf(zcmptype + 4,0x4b,"ZNAXIS%d",(ulong)(ndiv + 1));
          ffpkyj(outfptr,zcmptype + 4,naxes[ndiv],"length of original image axis",status);
        }
      }
      for (ndiv = 0; ndiv < naxis; ndiv = ndiv + 1) {
        snprintf(zcmptype + 4,0x4b,"ZTILE%d",(ulong)(ndiv + 1));
        ffpkyj(outfptr,zcmptype + 4,*(LONGLONG *)(&nQualifyDims + (long)ndiv * 2),
               "size of tiles to be compressed",status);
      }
      if (nrows._4_4_ < 0) {
        fVar1 = outfptr->Fptr->request_quantize_level;
        if ((fVar1 != 9999.0) || (NAN(fVar1))) {
          if (outfptr->Fptr->request_quantize_method == 0) {
            outfptr->Fptr->request_quantize_method = 1;
          }
          if ((outfptr->Fptr->request_quantize_method == 2) &&
             (iVar3 = strcmp((char *)&remain,"HCOMPRESS_1"), iVar3 == 0)) {
            outfptr->Fptr->request_quantize_method = 1;
            fprintf(_stderr,
                    "Warning: CFITSIO does not allow subtractive_dither_2 when using Hcompress algorithm.\nWill use subtractive_dither_1 instead.\n"
                   );
          }
          if (outfptr->Fptr->request_quantize_method == 1) {
            ffpkys(outfptr,"ZQUANTIZ","SUBTRACTIVE_DITHER_1","Pixel Quantization Algorithm",status);
            ffpky(outfptr,0x1f,"ZDITHER0",&outfptr->Fptr->request_dither_seed,
                  "dithering offset when quantizing floats",status);
          }
          else if (outfptr->Fptr->request_quantize_method == 2) {
            ffpkys(outfptr,"ZQUANTIZ","SUBTRACTIVE_DITHER_2","Pixel Quantization Algorithm",status);
            ffpky(outfptr,0x1f,"ZDITHER0",&outfptr->Fptr->request_dither_seed,
                  "dithering offset when quantizing floats",status);
            iVar3 = strcmp((char *)&remain,"RICE_1");
            if (iVar3 == 0) {
              strcpy((char *)&remain,"RICE_ONE");
            }
          }
          else if (outfptr->Fptr->request_quantize_method == -1) {
            ffpkys(outfptr,"ZQUANTIZ","NO_DITHER","No dithering during quantization",status);
          }
        }
        else {
          ffpkys(outfptr,"ZQUANTIZ","NONE","Lossless compression without quantization",status);
        }
      }
      ffpkys(outfptr,"ZCMPTYPE",(char *)&remain,"compression algorithm",status);
      if (outfptr->Fptr->request_compress_type == 0xb) {
        ffpkys(outfptr,"ZNAME1","BLOCKSIZE","compression block size",status);
        ffpkyj(outfptr,"ZVAL1",0x20,"pixels per block",status);
        ffpkys(outfptr,"ZNAME2","BYTEPIX","bytes per pixel (1, 2, 4, or 8)",status);
        if (nrows._4_4_ == 8) {
          ffpkyj(outfptr,"ZVAL2",1,"bytes per pixel (1, 2, 4, or 8)",status);
        }
        else if (nrows._4_4_ == 0x10) {
          ffpkyj(outfptr,"ZVAL2",2,"bytes per pixel (1, 2, 4, or 8)",status);
        }
        else {
          ffpkyj(outfptr,"ZVAL2",4,"bytes per pixel (1, 2, 4, or 8)",status);
        }
      }
      else if (outfptr->Fptr->request_compress_type == 0x29) {
        ffpkys(outfptr,"ZNAME1","SCALE","HCOMPRESS scale factor",status);
        ffpkye(outfptr,"ZVAL1",outfptr->Fptr->request_hcomp_scale,7,"HCOMPRESS scale factor",status)
        ;
        ffpkys(outfptr,"ZNAME2","SMOOTH","HCOMPRESS smooth option",status);
        ffpkyj(outfptr,"ZVAL2",(long)outfptr->Fptr->request_hcomp_smooth,"HCOMPRESS smooth option",
               status);
      }
      if (inbitpix == 0x14) {
        strcpy((char *)(actual_tilesize + 5),"offset data range to that of unsigned short");
        ffpkyg(outfptr,"BZERO",32768.0,0,(char *)(actual_tilesize + 5),status);
        strcpy((char *)(actual_tilesize + 5),"default scaling factor");
        ffpkyg(outfptr,"BSCALE",1.0,0,(char *)(actual_tilesize + 5),status);
      }
      else if (inbitpix == 10) {
        strcpy((char *)(actual_tilesize + 5),"offset data range to that of signed byte");
        ffpkyg(outfptr,"BZERO",-128.0,0,(char *)(actual_tilesize + 5),status);
        strcpy((char *)(actual_tilesize + 5),"default scaling factor");
        ffpkyg(outfptr,"BSCALE",1.0,0,(char *)(actual_tilesize + 5),status);
      }
      else if (inbitpix == 0x28) {
        strcpy((char *)(actual_tilesize + 5),"offset data range to that of unsigned long");
        ffpkyg(outfptr,"BZERO",2147483648.0,0,(char *)(actual_tilesize + 5),status);
        strcpy((char *)(actual_tilesize + 5),"default scaling factor");
        ffpkyg(outfptr,"BSCALE",1.0,0,(char *)(actual_tilesize + 5),status);
      }
      outfptr_local._4_4_ = *status;
    }
    else {
      ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_init_table)");
      *status = 0x19d;
      outfptr_local._4_4_ = 0x19d;
    }
  }
  else {
    outfptr_local._4_4_ = *status;
  }
  return outfptr_local._4_4_;
}

Assistant:

int imcomp_init_table(fitsfile *outfptr,
        int inbitpix,
        int naxis,
        long *naxes,
	int writebitpix,    /* write the ZBITPIX, ZNAXIS, and ZNAXES keyword? */
        int *status)
/* 
  create a BINTABLE extension for the output compressed image.
*/
{
    char keyname[FLEN_KEYWORD], zcmptype[12];
    int ii,  remain,  ndiv, addToDim, ncols, bitpix;
    long nrows;
    char *ttype[] = {"COMPRESSED_DATA", "ZSCALE", "ZZERO"};
    char *tform[3];
    char tf0[4], tf1[4], tf2[4];
    char *tunit[] = {"\0",            "\0",            "\0"  };
    char comm[FLEN_COMMENT];
    long actual_tilesize[MAX_COMPRESS_DIM]; /* Actual size to use for tiles */
    int is_primary=0; /* Is this attempting to write to the primary? */
    int nQualifyDims=0; /* For Hcompress, number of image dimensions with required pixels. */
    int noHigherDims=1; /* Set to true if all tile dims other than x are size 1. */
    int firstDim=-1, secondDim=-1; /* Indices of first and second tiles dimensions
                                with width > 1 */
    
    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (inbitpix < 0) && ((outfptr->Fptr)->request_quantize_level == NO_QUANTIZE) ) {
       if (((outfptr->Fptr)->request_compress_type != GZIP_1) &&
           ((outfptr->Fptr)->request_compress_type != GZIP_2)) {
         ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_init_table)");
         return(*status = DATA_COMPRESSION_ERR);
       }
    }
 
     /* set default compression parameter values, if undefined */
    
    if ( (outfptr->Fptr)->request_compress_type == 0) {
	/* use RICE_1 by default */
	(outfptr->Fptr)->request_compress_type = RICE_1;
    }

    if (inbitpix < 0 && (outfptr->Fptr)->request_quantize_level != NO_QUANTIZE) {  
	/* set defaults for quantizing floating point images */
	if ( (outfptr->Fptr)->request_quantize_method == 0) {
	      /* set default dithering method */
              (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
	}

	if ( (outfptr->Fptr)->request_quantize_level == 0) {
	    if ((outfptr->Fptr)->request_quantize_method == NO_DITHER) {
	        /* must use finer quantization if no dithering is done */
	        (outfptr->Fptr)->request_quantize_level = 16; 
	    } else {
	        (outfptr->Fptr)->request_quantize_level = 4; 
	    }
        }
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
/* do this in imcomp_get_compressed_image_par, instead
    if ( (outfptr->Fptr)->request_quantize_level != 0.)
        (outfptr->Fptr)->quantize_level = (outfptr->Fptr)->request_quantize_level;
*/
    /* test for the 2 special cases that represent unsigned integers */
    if (inbitpix == USHORT_IMG)
        bitpix = SHORT_IMG;
    else if (inbitpix == ULONG_IMG)
        bitpix = LONG_IMG;
    else if (inbitpix == SBYTE_IMG)
        bitpix = BYTE_IMG;
    else 
        bitpix = inbitpix;

    /* reset default tile dimensions too if required */
    memcpy(actual_tilesize, outfptr->Fptr->request_tilesize, MAX_COMPRESS_DIM * sizeof(long));

    if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1) {
         
         /* Tiles must ultimately have 2 (and only 2) dimensions, each with
             at least 4 pixels. First catch the case where the image
             itself won't allow this. */
         if (naxis < 2 ) {
            ffpmsg("Hcompress cannot be used with 1-dimensional images (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);
	 }
         for (ii=0; ii<naxis; ii++)
         {
            if (naxes[ii] >= 4)
               ++nQualifyDims;
         }
         if (nQualifyDims < 2)
         {
            ffpmsg("Hcompress minimum image dimension is 4 pixels (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);            
         }

         /* Handle 2 special cases for backwards compatibility.
            1) If both X and Y tile dims are set to full size, ignore
               any other requested dimensions and just set their sizes to 1. 
            2) If X is full size and all the rest are size 1, attempt to
               find a reasonable size for Y. All other 1-D tile specifications
               will be rejected. */
         for (ii=1; ii<naxis; ++ii)
            if (actual_tilesize[ii] != 0 && actual_tilesize[ii] != 1)
            {
               noHigherDims = 0;
               break;
            }

         if ((actual_tilesize[0] <= 0) &&
             (actual_tilesize[1] == -1) ){
	     
	    /* compress the whole image as a single tile */
             actual_tilesize[0] = naxes[0];
             actual_tilesize[1] = naxes[1];

              for (ii = 2; ii < naxis; ii++) {
	             /* set all higher tile dimensions = 1 */
                     actual_tilesize[ii] = 1;
	      }

         } else if ((actual_tilesize[0] <= 0) && noHigherDims) {
	     
             /*
              The Hcompress algorithm is inherently 2D in nature, so the row by row
	      tiling that is used for other compression algorithms is not appropriate.
	      If the image has less than 30 rows, then the entire image will be compressed
	      as a single tile.  Otherwise the tiles will consist of 16 rows of the image. 
	      This keeps the tiles to a reasonable size, and it also includes enough rows
	      to allow good compression efficiency.  If the last tile of the image 
	      happens to contain less than 4 rows, then find another tile size with
	      between 14 and 30 rows (preferably even), so that the last tile has 
	      at least 4 rows
	     */ 
	      
             /* 1st tile dimension is the row length of the image */
             actual_tilesize[0] = naxes[0];

              if (naxes[1] <= 30) {  /* use whole image if it is small */
                   actual_tilesize[1] = naxes[1];
	      } else {
                /* look for another good tile dimension */
	          if        (naxes[1] % 16 == 0 || naxes[1] % 16 > 3) {
                      actual_tilesize[1] = 16;
		  } else if (naxes[1] % 24 == 0 || naxes[1] % 24 > 3) {
                      actual_tilesize[1] = 24;
		  } else if (naxes[1] % 20 == 0 || naxes[1] % 20 > 3) {
                      actual_tilesize[1] = 20;
		  } else if (naxes[1] % 30 == 0 || naxes[1] % 30 > 3) {
                      actual_tilesize[1] = 30;
		  } else if (naxes[1] % 28 == 0 || naxes[1] % 28 > 3) {
                      actual_tilesize[1] = 28;
		  } else if (naxes[1] % 26 == 0 || naxes[1] % 26 > 3) {
                      actual_tilesize[1] = 26;
		  } else if (naxes[1] % 22 == 0 || naxes[1] % 22 > 3) {
                      actual_tilesize[1] = 22;
		  } else if (naxes[1] % 18 == 0 || naxes[1] % 18 > 3) {
                      actual_tilesize[1] = 18;
		  } else if (naxes[1] % 14 == 0 || naxes[1] % 14 > 3) {
                      actual_tilesize[1] = 14;
		  } else  {
                      actual_tilesize[1] = 17;
		  }
	      }
        } else {
           if (actual_tilesize[0] <= 0)
              actual_tilesize[0] = naxes[0];
           for (ii=1; ii<naxis; ++ii)
           {
              if (actual_tilesize[ii] < 0)
                 actual_tilesize[ii] = naxes[ii];
              else if (actual_tilesize[ii] == 0)
                 actual_tilesize[ii] = 1;
           }
        }
        
        for (ii=0; ii<naxis; ++ii)
        {
           if (actual_tilesize[ii] > 1)
           {
              if (firstDim < 0)
                 firstDim = ii;
              else if (secondDim < 0)
                 secondDim = ii;
              else
              {
                 ffpmsg("Hcompress tiles can only have 2 dimensions (imcomp_init_table)");
                 return(*status = DATA_COMPRESSION_ERR);
              }
           }
        }
        if (firstDim < 0 || secondDim < 0)
        {
            ffpmsg("Hcompress tiles must have 2 dimensions (imcomp_init_table)");
            return(*status = DATA_COMPRESSION_ERR);
        }
        
        if (actual_tilesize[firstDim] < 4 || actual_tilesize[secondDim] < 4)
        {
           ffpmsg("Hcompress minimum tile dimension is 4 pixels (imcomp_init_table)");
           return (*status = DATA_COMPRESSION_ERR);
        }
	
        /* check if requested tile size causes the last tile to to have less than 4 pixels */
        remain = naxes[firstDim] % (actual_tilesize[firstDim]);  /* 1st dimension */
        if (remain > 0 && remain < 4) {
            ndiv = naxes[firstDim]/actual_tilesize[firstDim]; /* integer truncation is intentional */
            addToDim = ceil((double)remain/ndiv);
            (actual_tilesize[firstDim]) += addToDim; /* increase tile size */
	   
            remain = naxes[firstDim] % (actual_tilesize[firstDim]);
            if (remain > 0 && remain < 4) {
                ffpmsg("Last tile along 1st dimension has less than 4 pixels (imcomp_init_table)");
                return(*status = DATA_COMPRESSION_ERR);	
            }        
        }

        remain = naxes[secondDim] % (actual_tilesize[secondDim]);  /* 2nd dimension */
        if (remain > 0 && remain < 4) {
            ndiv = naxes[secondDim]/actual_tilesize[secondDim]; /* integer truncation is intentional */
            addToDim = ceil((double)remain/ndiv);
            (actual_tilesize[secondDim]) += addToDim; /* increase tile size */
	   
            remain = naxes[secondDim] % (actual_tilesize[secondDim]);
            if (remain > 0 && remain < 4) {
                ffpmsg("Last tile along 2nd dimension has less than 4 pixels (imcomp_init_table)");
                return(*status = DATA_COMPRESSION_ERR);	
            }        
        }

    } /* end, if HCOMPRESS_1 */
    
    for (ii = 0; ii < naxis; ii++) {
	if (ii == 0) { /* first axis is different */
	    if (actual_tilesize[ii] <= 0) {
                actual_tilesize[ii] = naxes[ii]; 
	    }
	} else {
	    if (actual_tilesize[ii] < 0) {
                actual_tilesize[ii] = naxes[ii];  /* negative value maean use whole length */
	    } else if (actual_tilesize[ii] == 0) {
                actual_tilesize[ii] = 1;  /* zero value means use default value = 1 */
	    }
	}
    }

    /* ---- set up array of TFORM strings -------------------------------*/
    if ( (outfptr->Fptr)->request_huge_hdu != 0) {
        strcpy(tf0, "1QB");
    } else {
        strcpy(tf0, "1PB");
    }
    strcpy(tf1, "1D");
    strcpy(tf2, "1D");

    tform[0] = tf0;
    tform[1] = tf1;
    tform[2] = tf2;

    /* calculate number of rows in output table */
    nrows = 1;
    for (ii = 0; ii < naxis; ii++)
    {
        nrows = nrows * ((naxes[ii] - 1)/ (actual_tilesize[ii]) + 1);
    }

    /* determine the default  number of columns in the output table */
    if (bitpix < 0 && (outfptr->Fptr)->request_quantize_level != NO_QUANTIZE)  
        ncols = 3;  /* quantized and scaled floating point image */
    else
        ncols = 1; /* default table has just one 'COMPRESSED_DATA' column */

    if ((outfptr->Fptr)->request_compress_type == RICE_1)
    {
        strcpy(zcmptype, "RICE_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == GZIP_1)
    {
        strcpy(zcmptype, "GZIP_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == GZIP_2)
    {
        strcpy(zcmptype, "GZIP_2");
    }
    else if ((outfptr->Fptr)->request_compress_type == BZIP2_1)
    {
        strcpy(zcmptype, "BZIP2_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == PLIO_1)
    {
        strcpy(zcmptype, "PLIO_1");
       /* the PLIO compression algorithm outputs short integers, not bytes */
        if ( (outfptr->Fptr)->request_huge_hdu != 0) {
            strcpy(tform[0], "1QI");
        } else {
            strcpy(tform[0], "1PI");
        }
    }
    else if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1)
    {
        strcpy(zcmptype, "HCOMPRESS_1");
    }
    else if ((outfptr->Fptr)->request_compress_type == NOCOMPRESS)
    {
        strcpy(zcmptype, "NOCOMPRESS");
    }    
    else
    {
        ffpmsg("unknown compression type (imcomp_init_table)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* If attempting to write compressed image to primary, the
       call to ffcrtb will increment Fptr->curhdu to 1.  Therefore
       we need to test now for setting is_primary */
    is_primary = (outfptr->Fptr->curhdu == 0);
    /* create the bintable extension to contain the compressed image */
    ffcrtb(outfptr, BINARY_TBL, nrows, ncols, ttype, 
                tform, tunit, 0, status);

    /* Add standard header keywords. */
    ffpkyl (outfptr, "ZIMAGE", 1, 
           "extension contains compressed image", status);  

    if (writebitpix) {
        /*  write the keywords defining the datatype and dimensions of */
	/*  the uncompressed image.  If not, these keywords will be */
        /*  copied later from the input uncompressed image  */
	
        if (is_primary)   
            ffpkyl (outfptr, "ZSIMPLE", 1,
			"file does conform to FITS standard", status);
        ffpkyj (outfptr, "ZBITPIX", bitpix,
			"data type of original image", status);
        ffpkyj (outfptr, "ZNAXIS", naxis,
			"dimension of original image", status);

        for (ii = 0;  ii < naxis;  ii++)
        {
            snprintf (keyname, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
            ffpkyj (outfptr, keyname, naxes[ii],
			"length of original image axis", status);
        }
    }
                      
    for (ii = 0;  ii < naxis;  ii++)
    {
        snprintf (keyname, FLEN_KEYWORD,"ZTILE%d", ii+1);
        ffpkyj (outfptr, keyname, actual_tilesize[ii],
			"size of tiles to be compressed", status);
    }

    if (bitpix < 0) {
       
	if ((outfptr->Fptr)->request_quantize_level == NO_QUANTIZE) {
	    ffpkys(outfptr, "ZQUANTIZ", "NONE", 
	      "Lossless compression without quantization", status);
	} else {
	    
	    /* Unless dithering has been specifically turned off by setting */
	    /* request_quantize_method = -1, use dithering by default */
	    /* when quantizing floating point images. */
	
	    if ( (outfptr->Fptr)->request_quantize_method == 0) 
              (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
            
            /* HCompress must not use SUBTRACTIVE_DITHER_2. If user is requesting
               this, assign SUBTRACTIVE_DITHER_1 instead. */
            if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_2
              && !(strcmp(zcmptype,"HCOMPRESS_1"))) {
                 (outfptr->Fptr)->request_quantize_method = SUBTRACTIVE_DITHER_1;
               fprintf(stderr,"Warning: CFITSIO does not allow subtractive_dither_2 when using Hcompress algorithm.\nWill use subtractive_dither_1 instead.\n");
            }
                 
	    if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_1) {
	      ffpkys(outfptr, "ZQUANTIZ", "SUBTRACTIVE_DITHER_1", 
	        "Pixel Quantization Algorithm", status);

	      /* also write the associated ZDITHER0 keyword with a default value */
	      /* which may get updated later. */
              ffpky(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->request_dither_seed), 
	       "dithering offset when quantizing floats", status);
 
            } else if ((outfptr->Fptr)->request_quantize_method == SUBTRACTIVE_DITHER_2) {
	      ffpkys(outfptr, "ZQUANTIZ", "SUBTRACTIVE_DITHER_2", 
	        "Pixel Quantization Algorithm", status);

	      /* also write the associated ZDITHER0 keyword with a default value */
	      /* which may get updated later. */
              ffpky(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->request_dither_seed), 
	       "dithering offset when quantizing floats", status);

	      if (!strcmp(zcmptype, "RICE_1"))  {
	        /* when using this new dithering method, change the compression type */
		/* to an alias, so that old versions of funpack will not be able to */
		/* created a corrupted uncompressed image. */
		/* ******* can remove this cludge after about June 2015, after most old versions of fpack are gone */
        	strcpy(zcmptype, "RICE_ONE");
	      }

            } else if ((outfptr->Fptr)->request_quantize_method == NO_DITHER) {
	      ffpkys(outfptr, "ZQUANTIZ", "NO_DITHER", 
	        "No dithering during quantization", status);
	    }

	}
    }

    ffpkys (outfptr, "ZCMPTYPE", zcmptype,
	          "compression algorithm", status);

    /* write any algorithm-specific keywords */
    if ((outfptr->Fptr)->request_compress_type == RICE_1)
    {
        ffpkys (outfptr, "ZNAME1", "BLOCKSIZE",
            "compression block size", status);

        /* for now at least, the block size is always 32 */
        ffpkyj (outfptr, "ZVAL1", 32,
			"pixels per block", status);

        ffpkys (outfptr, "ZNAME2", "BYTEPIX",
            "bytes per pixel (1, 2, 4, or 8)", status);

        if (bitpix == BYTE_IMG)
            ffpkyj (outfptr, "ZVAL2", 1,
			"bytes per pixel (1, 2, 4, or 8)", status);
        else if (bitpix == SHORT_IMG)
            ffpkyj (outfptr, "ZVAL2", 2,
			"bytes per pixel (1, 2, 4, or 8)", status);
        else 
            ffpkyj (outfptr, "ZVAL2", 4,
			"bytes per pixel (1, 2, 4, or 8)", status);

    }
    else if ((outfptr->Fptr)->request_compress_type == HCOMPRESS_1)
    {
        ffpkys (outfptr, "ZNAME1", "SCALE",
            "HCOMPRESS scale factor", status);
        ffpkye (outfptr, "ZVAL1", (outfptr->Fptr)->request_hcomp_scale,
		7, "HCOMPRESS scale factor", status);

        ffpkys (outfptr, "ZNAME2", "SMOOTH",
            "HCOMPRESS smooth option", status);
        ffpkyj (outfptr, "ZVAL2", (long) (outfptr->Fptr)->request_hcomp_smooth,
			"HCOMPRESS smooth option", status);
    }

    /* Write the BSCALE and BZERO keywords, if an unsigned integer image */
    if (inbitpix == USHORT_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned short");
        ffpkyg(outfptr, "BZERO", 32768., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (inbitpix == SBYTE_IMG)
    {
        strcpy(comm, "offset data range to that of signed byte");
        ffpkyg(outfptr, "BZERO", -128., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (inbitpix == ULONG_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned long");
        ffpkyg(outfptr, "BZERO", 2147483648., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(outfptr, "BSCALE", 1.0, 0, comm, status);
    }

    return(*status);
}